

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

node_type * __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
::new_internal_node(btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                    *this,node_type *parent)

{
  size_type n;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *n_00;
  template_ElementType<1UL> *ptVar1;
  
  n = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
      ::InternalSize();
  n_00 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
          *)Allocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>
                      (&(this->root_).
                        super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_*>
                        .
                        super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>
                        ._M_head_impl,n);
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  ::init_leaf(n_00,parent,0x3d);
  ptVar1 = btree_node<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
           ::GetField<1ul>((btree_node<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
                            *)n_00);
  ptVar1[3] = '\0';
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  ::mutable_child(n_00,0);
  return n_00;
}

Assistant:

node_type* new_internal_node(node_type *parent) {
            node_type *p = allocate(node_type::InternalSize());
            return node_type::init_internal(p, parent);
        }